

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

ExpEmit __thiscall FxConstant::Emit(FxConstant *this,VMFunctionBuilder *build)

{
  PType *pPVar1;
  uint uVar2;
  int iVar3;
  VM_ATAG tag;
  FString FStack_28;
  
  uVar2 = (*(((this->value).Type)->super_DObject)._vptr_DObject[0x12])();
  if (uVar2 < 4) {
    switch(uVar2) {
    case 0:
      iVar3 = VMFunctionBuilder::GetConstantInt(build,(this->value).field_1.Int);
      break;
    case 1:
      iVar3 = VMFunctionBuilder::GetConstantFloat(build,(this->value).field_1.Float);
      break;
    case 2:
      ExpVal::GetString((ExpVal *)&FStack_28);
      iVar3 = VMFunctionBuilder::GetConstantString(build,&FStack_28);
      FString::~FString(&FStack_28);
      break;
    case 3:
      pPVar1 = (this->value).Type;
      if (pPVar1 == (PType *)TypeState) {
        tag = '\a';
      }
      else {
        iVar3 = (*(((PBasicType *)&pPVar1->super_DObject)->super_PType).super_DObject._vptr_DObject
                  [0x11])();
        tag = iVar3 == 0x17;
      }
      iVar3 = VMFunctionBuilder::GetConstantAddress(build,(this->value).field_1.pointer,tag);
    }
  }
  else {
    iVar3 = 0;
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,"Cannot emit needed constant");
  }
  return (ExpEmit)(((uint3)uVar2 & 0xff) * 0x100 + ((uint3)iVar3 & 0xff) + 0x10000);
}

Assistant:

ExpEmit FxConstant::Emit(VMFunctionBuilder *build)
{
	ExpEmit out;

	out.Konst = true;
	int regtype = value.Type->GetRegType();
	out.RegType = regtype;
	if (regtype == REGT_INT)
	{
		out.RegNum = build->GetConstantInt(value.Int);
	}
	else if (regtype == REGT_FLOAT)
	{
		out.RegNum = build->GetConstantFloat(value.Float);
	}
	else if (regtype == REGT_POINTER)
	{
		VM_ATAG tag = ATAG_GENERIC;
		if (value.Type == TypeState)
		{
			tag = ATAG_STATE;
		}
		else if (value.Type->GetLoadOp() == OP_LO)
		{
			tag = ATAG_OBJECT;
		}
		out.RegNum = build->GetConstantAddress(value.pointer, tag);
	}
	else if (regtype == REGT_STRING)
	{
		out.RegNum = build->GetConstantString(value.GetString());
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot emit needed constant");
		out.RegNum = 0;
	}
	return out;
}